

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

string * __thiscall
Assimp::Ogre::VertexElement::SemanticToString_abi_cxx11_
          (string *__return_storage_ptr__,VertexElement *this,Semantic semantic)

{
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  undefined4 local_14;
  string *psStack_10;
  Semantic semantic_local;
  
  local_14 = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  switch(local_14) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"POSITION",&local_15);
    std::allocator<char>::~allocator(&local_15);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BLEND_WEIGHTS",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BLEND_INDICES",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"NORMAL",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DIFFUSE",&local_28);
    std::allocator<char>::~allocator(&local_28);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"SPECULAR",&local_29);
    std::allocator<char>::~allocator(&local_29);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"TEXTURE_COORDINATES",&local_2a);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BINORMAL",&local_2b);
    std::allocator<char>::~allocator(&local_2b);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"TANGENT",&local_2c);
    std::allocator<char>::~allocator(&local_2c);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Uknown_VertexElement::Semantic",&local_2d);
    std::allocator<char>::~allocator(&local_2d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VertexElement::SemanticToString(Semantic semantic)
{
    switch(semantic)
    {
        case VES_POSITION:              return "POSITION";
        case VES_BLEND_WEIGHTS:         return "BLEND_WEIGHTS";
        case VES_BLEND_INDICES:         return "BLEND_INDICES";
        case VES_NORMAL:                return "NORMAL";
        case VES_DIFFUSE:               return "DIFFUSE";
        case VES_SPECULAR:              return "SPECULAR";
        case VES_TEXTURE_COORDINATES:   return "TEXTURE_COORDINATES";
        case VES_BINORMAL:              return "BINORMAL";
        case VES_TANGENT:               return "TANGENT";
    }
    return "Uknown_VertexElement::Semantic";
}